

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_promise_resolve_function_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue *pJVar1;
  
  pJVar1 = *(JSValue **)((long)val.u.ptr + 0x30);
  if (pJVar1 != (JSValue *)0x0) {
    js_promise_resolve_function_free_resolved(rt,(JSPromiseFunctionDataResolved *)pJVar1[1].u.ptr);
    JS_FreeValueRT(rt,*pJVar1);
    (*(rt->mf).js_free)(&rt->malloc_state,pJVar1);
    return;
  }
  return;
}

Assistant:

static void js_promise_resolve_function_finalizer(JSRuntime *rt, JSValue val)
{
    JSPromiseFunctionData *s = JS_VALUE_GET_OBJ(val)->u.promise_function_data;
    if (s) {
        js_promise_resolve_function_free_resolved(rt, s->presolved);
        JS_FreeValueRT(rt, s->promise);
        js_free_rt(rt, s);
    }
}